

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O2

QString * __thiscall
QDateTimeParser::sectionText(QString *__return_storage_ptr__,QDateTimeParser *this,int sectionIndex)

{
  SectionNode *pSVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = sectionNode(this,sectionIndex);
  (*this->_vptr_QDateTimeParser[2])(&QStack_48,this);
  sectionText(__return_storage_ptr__,this,(QString *)&QStack_48,sectionIndex,pSVar1->pos);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDateTimeParser::sectionText(int sectionIndex) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    return sectionText(displayText(), sectionIndex, sn.pos);
}